

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O2

void __thiscall OpenMD::AtomStamp::validate(AtomStamp *this)

{
  pointer pcVar1;
  string asStack_58 [8];
  long local_50;
  undefined8 local_38 [4];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Type).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string(asStack_58,(string *)&(this->Type).data_);
    std::__cxx11::string::~string(asStack_58);
    std::__cxx11::string::~string((string *)local_38);
    if (local_50 == 0) {
      pcVar1 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)local_38,asStack_58);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar1,local_38[0]);
      std::__cxx11::string::~string((string *)local_38);
      std::__cxx11::string::~string(asStack_58);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void AtomStamp::validate() {
    DataHolder::validate();
    CheckParameter(Type, isNotEmpty());
  }